

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O3

void * hash_table_get(HashTable *hash_table,char *key)

{
  HashTableEntry *pHVar1;
  int iVar2;
  unsigned_long uVar3;
  
  uVar3 = hash(hash_table->size,key);
  pHVar1 = hash_table->table[uVar3];
  while( true ) {
    if (pHVar1 == (HashTableEntry *)0x0) {
      return (void *)0x0;
    }
    iVar2 = strcmp(key,pHVar1->key);
    if (iVar2 < 1) break;
    pHVar1 = pHVar1->next;
  }
  if (iVar2 != 0) {
    return (void *)0x0;
  }
  return pHVar1->literal;
}

Assistant:

void *hash_table_get(HashTable *hash_table, char *key) {
  unsigned long int hash_literal = hash(hash_table->size, key);

  HashTableEntry *next = hash_table->table[hash_literal];

  if (next != NULL) {
    HashTableEntry *last;

    while (next != NULL && strcmp(key, next->key) > 0) {
      last = next;
      next = last->next;
    }

    if (next != NULL && strcmp(key, next->key) == 0) {
      return next->literal;
    }
  }

  return NULL;
}